

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

cmDependInformation * __thiscall
cmLBDepend::GetDependInformation(cmLBDepend *this,char *file,char *extraPath)

{
  iterator iVar1;
  cmDependInformation *this_00;
  mapped_type *ppcVar2;
  string fullPath;
  string local_60;
  string local_40;
  
  FullPath_abi_cxx11_(&local_60,this,file,extraPath);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>
          ::find(&(this->DependInformationMap)._M_t,&local_60);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (cmDependInformation *)operator_new(0xa0);
    cmDependInformation::cmDependInformation(this_00);
    std::__cxx11::string::_M_assign((string *)&this_00->FullPath);
    cmsys::SystemTools::GetFilenamePath(&local_40,&local_60);
    std::__cxx11::string::operator=((string *)&this_00->PathOnly,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::assign((char *)&this_00->IncludeName);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>
              ::operator[](&this->DependInformationMap,&local_60);
    *ppcVar2 = this_00;
  }
  else {
    this_00 = *(cmDependInformation **)(iVar1._M_node + 2);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return this_00;
}

Assistant:

cmDependInformation* GetDependInformation(const char* file,
                                            const char* extraPath)
  {
    // Get the full path for the file so that lookup is unambiguous.
    std::string fullPath = this->FullPath(file, extraPath);

    // Try to find the file's instance of cmDependInformation.
    DependInformationMapType::const_iterator result =
      this->DependInformationMap.find(fullPath);
    if (result != this->DependInformationMap.end()) {
      // Found an instance, return it.
      return result->second;
    }
    // Didn't find an instance.  Create a new one and save it.
    cmDependInformation* info = new cmDependInformation;
    info->FullPath = fullPath;
    info->PathOnly = cmSystemTools::GetFilenamePath(fullPath);
    info->IncludeName = file;
    this->DependInformationMap[fullPath] = info;
    return info;
  }